

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [8];
  Scene *pSVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar40;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar41;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  float fVar53;
  float fVar54;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar55;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar67;
  float fVar68;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar69;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar70;
  float fVar71;
  undefined1 auVar66 [16];
  float fVar72;
  float fVar87;
  float fVar88;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar89;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar104;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar132;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar130;
  float fVar131;
  undefined1 auVar129 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar139 [64];
  float fVar143;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [64];
  float fVar152;
  undefined1 auVar153 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar154 [64];
  float fVar158;
  undefined1 auVar159 [16];
  float fVar164;
  undefined1 auVar160 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar161 [64];
  float fVar165;
  float fVar170;
  undefined1 auVar166 [16];
  float fVar168;
  float fVar169;
  float fVar171;
  undefined1 auVar167 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_af9;
  undefined1 local_af8 [16];
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  undefined8 local_ad8;
  float fStack_ad0;
  float fStack_acc;
  Ray *local_ac8;
  int local_abc;
  undefined8 local_ab8;
  float fStack_ab0;
  float fStack_aac;
  undefined1 local_aa8 [8];
  float fStack_aa0;
  float fStack_a9c;
  undefined1 local_a98 [8];
  float fStack_a90;
  float fStack_a8c;
  undefined1 local_a88 [8];
  float fStack_a80;
  float fStack_a7c;
  Scene *local_a78;
  RayQueryContext *local_a70;
  undefined1 local_a68 [8];
  float fStack_a60;
  float fStack_a5c;
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [8];
  float fStack_a30;
  float fStack_a2c;
  long local_a28;
  ulong local_a20;
  ulong *local_a18;
  long local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  RTCFilterFunctionNArguments local_9d8;
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar143 = ray->tfar;
    auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar143) {
      local_a18 = local_7d0;
      aVar5 = (ray->dir).field_0;
      auVar45 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar33 = vandps_avx((undefined1  [16])aVar5,auVar33);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar33 = vcmpps_avx(auVar33,auVar92,1);
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar92 = vdivps_avx(auVar93,(undefined1  [16])aVar5);
      auVar94._8_4_ = 0x5d5e0b6b;
      auVar94._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar94._12_4_ = 0x5d5e0b6b;
      auVar33 = vblendvps_avx(auVar92,auVar94,auVar33);
      auVar73._0_4_ = auVar33._0_4_ * 0.99999964;
      auVar73._4_4_ = auVar33._4_4_ * 0.99999964;
      auVar73._8_4_ = auVar33._8_4_ * 0.99999964;
      auVar73._12_4_ = auVar33._12_4_ * 0.99999964;
      auVar57._0_4_ = auVar33._0_4_ * 1.0000004;
      auVar57._4_4_ = auVar33._4_4_ * 1.0000004;
      auVar57._8_4_ = auVar33._8_4_ * 1.0000004;
      auVar57._12_4_ = auVar33._12_4_ * 1.0000004;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar115 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar129 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar136 = ZEXT1664(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
      auVar33 = vshufps_avx(auVar73,auVar73,0);
      auVar137 = ZEXT1664(auVar33);
      auVar33 = vmovshdup_avx(auVar73);
      auVar92 = vshufps_avx(auVar73,auVar73,0x55);
      auVar139 = ZEXT1664(auVar92);
      auVar92 = vshufpd_avx(auVar73,auVar73,1);
      auVar93 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar145 = ZEXT1664(auVar93);
      auVar93 = vshufps_avx(auVar57,auVar57,0);
      auVar154 = ZEXT1664(auVar93);
      auVar93 = vshufps_avx(auVar57,auVar57,0x55);
      auVar161 = ZEXT1664(auVar93);
      local_a20 = (ulong)(auVar73._0_4_ < 0.0) << 4;
      uVar29 = (ulong)(auVar33._0_4_ < 0.0) << 4 | 0x20;
      auVar33 = vshufps_avx(auVar57,auVar57,0xaa);
      auVar110 = ZEXT1664(auVar33);
      uVar17 = (ulong)(auVar92._0_4_ < 0.0) << 4 | 0x40;
      uVar30 = local_a20 ^ 0x10;
      auVar33 = vshufps_avx(auVar45,auVar45,0);
      auVar167 = ZEXT1664(auVar33);
      local_8b8 = vshufps_avx(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),0);
      local_9a8 = mm_lookupmask_ps._240_16_;
      local_a70 = context;
      do {
        uVar31 = local_a18[-1];
        local_a18 = local_a18 + -1;
        while( true ) {
          local_908 = auVar115._0_16_;
          local_918 = auVar129._0_16_;
          local_928 = auVar136._0_16_;
          if ((uVar31 & 8) != 0) break;
          uVar12 = uVar31 & 0xfffffffffffffff0;
          fVar143 = (ray->dir).field_0.m128[3];
          auVar32._4_4_ = fVar143;
          auVar32._0_4_ = fVar143;
          auVar32._8_4_ = fVar143;
          auVar32._12_4_ = fVar143;
          pfVar3 = (float *)(uVar12 + 0x80 + local_a20);
          pfVar1 = (float *)(uVar12 + 0x20 + local_a20);
          auVar43._0_4_ = fVar143 * *pfVar3 + *pfVar1;
          auVar43._4_4_ = fVar143 * pfVar3[1] + pfVar1[1];
          auVar43._8_4_ = fVar143 * pfVar3[2] + pfVar1[2];
          auVar43._12_4_ = fVar143 * pfVar3[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar43,local_908);
          auVar44._0_4_ = auVar137._0_4_ * auVar33._0_4_;
          auVar44._4_4_ = auVar137._4_4_ * auVar33._4_4_;
          auVar44._8_4_ = auVar137._8_4_ * auVar33._8_4_;
          auVar44._12_4_ = auVar137._12_4_ * auVar33._12_4_;
          pfVar3 = (float *)(uVar12 + 0x80 + uVar29);
          auVar33 = vmaxps_avx(auVar167._0_16_,auVar44);
          pfVar1 = (float *)(uVar12 + 0x20 + uVar29);
          auVar58._0_4_ = fVar143 * *pfVar3 + *pfVar1;
          auVar58._4_4_ = fVar143 * pfVar3[1] + pfVar1[1];
          auVar58._8_4_ = fVar143 * pfVar3[2] + pfVar1[2];
          auVar58._12_4_ = fVar143 * pfVar3[3] + pfVar1[3];
          auVar92 = vsubps_avx(auVar58,local_918);
          pfVar3 = (float *)(uVar12 + 0x80 + uVar17);
          pfVar1 = (float *)(uVar12 + 0x20 + uVar17);
          auVar74._0_4_ = fVar143 * *pfVar3 + *pfVar1;
          auVar74._4_4_ = fVar143 * pfVar3[1] + pfVar1[1];
          auVar74._8_4_ = fVar143 * pfVar3[2] + pfVar1[2];
          auVar74._12_4_ = fVar143 * pfVar3[3] + pfVar1[3];
          auVar59._0_4_ = auVar139._0_4_ * auVar92._0_4_;
          auVar59._4_4_ = auVar139._4_4_ * auVar92._4_4_;
          auVar59._8_4_ = auVar139._8_4_ * auVar92._8_4_;
          auVar59._12_4_ = auVar139._12_4_ * auVar92._12_4_;
          auVar92 = vsubps_avx(auVar74,local_928);
          auVar75._0_4_ = auVar145._0_4_ * auVar92._0_4_;
          auVar75._4_4_ = auVar145._4_4_ * auVar92._4_4_;
          auVar75._8_4_ = auVar145._8_4_ * auVar92._8_4_;
          auVar75._12_4_ = auVar145._12_4_ * auVar92._12_4_;
          auVar92 = vmaxps_avx(auVar59,auVar75);
          pfVar3 = (float *)(uVar12 + 0x80 + uVar30);
          pfVar1 = (float *)(uVar12 + 0x20 + uVar30);
          auVar76._0_4_ = fVar143 * *pfVar3 + *pfVar1;
          auVar76._4_4_ = fVar143 * pfVar3[1] + pfVar1[1];
          auVar76._8_4_ = fVar143 * pfVar3[2] + pfVar1[2];
          auVar76._12_4_ = fVar143 * pfVar3[3] + pfVar1[3];
          auVar33 = vmaxps_avx(auVar33,auVar92);
          auVar92 = vsubps_avx(auVar76,local_908);
          auVar60._0_4_ = auVar154._0_4_ * auVar92._0_4_;
          auVar60._4_4_ = auVar154._4_4_ * auVar92._4_4_;
          auVar60._8_4_ = auVar154._8_4_ * auVar92._8_4_;
          auVar60._12_4_ = auVar154._12_4_ * auVar92._12_4_;
          auVar92 = vminps_avx(local_8b8,auVar60);
          pfVar3 = (float *)(uVar12 + 0x80 + (uVar29 ^ 0x10));
          pfVar1 = (float *)(uVar12 + 0x20 + (uVar29 ^ 0x10));
          auVar77._0_4_ = fVar143 * *pfVar3 + *pfVar1;
          auVar77._4_4_ = fVar143 * pfVar3[1] + pfVar1[1];
          auVar77._8_4_ = fVar143 * pfVar3[2] + pfVar1[2];
          auVar77._12_4_ = fVar143 * pfVar3[3] + pfVar1[3];
          auVar45 = vsubps_avx(auVar77,local_918);
          auVar78._0_4_ = auVar161._0_4_ * auVar45._0_4_;
          auVar78._4_4_ = auVar161._4_4_ * auVar45._4_4_;
          auVar78._8_4_ = auVar161._8_4_ * auVar45._8_4_;
          auVar78._12_4_ = auVar161._12_4_ * auVar45._12_4_;
          pfVar3 = (float *)(uVar12 + 0x80 + (uVar17 ^ 0x10));
          pfVar1 = (float *)(uVar12 + 0x20 + (uVar17 ^ 0x10));
          auVar95._0_4_ = fVar143 * *pfVar3 + *pfVar1;
          auVar95._4_4_ = fVar143 * pfVar3[1] + pfVar1[1];
          auVar95._8_4_ = fVar143 * pfVar3[2] + pfVar1[2];
          auVar95._12_4_ = fVar143 * pfVar3[3] + pfVar1[3];
          auVar45 = vsubps_avx(auVar95,local_928);
          auVar96._0_4_ = auVar110._0_4_ * auVar45._0_4_;
          auVar96._4_4_ = auVar110._4_4_ * auVar45._4_4_;
          auVar96._8_4_ = auVar110._8_4_ * auVar45._8_4_;
          auVar96._12_4_ = auVar110._12_4_ * auVar45._12_4_;
          auVar45 = vminps_avx(auVar78,auVar96);
          auVar92 = vminps_avx(auVar92,auVar45);
          if (((uint)uVar31 & 7) == 6) {
            auVar92 = vcmpps_avx(auVar33,auVar92,2);
            auVar33 = vcmpps_avx(*(undefined1 (*) [16])(uVar12 + 0xe0),auVar32,2);
            auVar45 = vcmpps_avx(auVar32,*(undefined1 (*) [16])(uVar12 + 0xf0),1);
            auVar33 = vandps_avx(auVar33,auVar45);
            auVar33 = vandps_avx(auVar33,auVar92);
          }
          else {
            auVar33 = vcmpps_avx(auVar33,auVar92,2);
          }
          auVar33 = vpslld_avx(auVar33,0x1f);
          uVar13 = vmovmskps_avx(auVar33);
          if (uVar13 == 0) goto LAB_002c3079;
          lVar7 = 0;
          if ((byte)uVar13 != 0) {
            for (; ((byte)uVar13 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar31 = *(ulong *)(uVar12 + lVar7 * 8);
          uVar13 = (uVar13 & 0xff) - 1 & uVar13 & 0xff;
          if (uVar13 != 0) {
            *local_a18 = uVar31;
            local_a18 = local_a18 + 1;
            lVar7 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar31 = *(ulong *)(uVar12 + lVar7 * 8);
            uVar13 = uVar13 - 1 & uVar13;
            uVar14 = (ulong)uVar13;
            if (uVar13 != 0) {
              do {
                *local_a18 = uVar31;
                local_a18 = local_a18 + 1;
                lVar7 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar31 = *(ulong *)(uVar12 + lVar7 * 8);
                uVar14 = uVar14 & uVar14 - 1;
              } while (uVar14 != 0);
            }
          }
        }
        local_a28 = (ulong)((uint)uVar31 & 0xf) - 8;
        if (local_a28 != 0) {
          uVar31 = uVar31 & 0xfffffffffffffff0;
          pSVar24 = local_a70->scene;
          local_a10 = 0;
          local_938 = auVar137._0_16_;
          local_948 = auVar139._0_16_;
          local_958 = auVar145._0_16_;
          local_968 = auVar154._0_16_;
          local_978 = auVar161._0_16_;
          local_988 = auVar110._0_16_;
          local_998 = auVar167._0_16_;
          local_a78 = pSVar24;
          local_ac8 = ray;
          do {
            lVar27 = local_a10 * 0x50;
            pGVar6 = (pSVar24->geometries).items[*(uint *)(uVar31 + 0x30 + lVar27)].ptr;
            fVar143 = (pGVar6->time_range).lower;
            fVar143 = pGVar6->fnumTimeSegments *
                      (((ray->dir).field_0.m128[3] - fVar143) /
                      ((pGVar6->time_range).upper - fVar143));
            auVar33 = vroundss_avx(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),9);
            auVar33 = vminss_avx(auVar33,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar61 = vmaxss_avx(auVar122._0_16_,auVar33);
            lVar15 = (long)(int)auVar61._0_4_ * 0x38;
            uVar28 = (ulong)*(uint *)(uVar31 + 4 + lVar27);
            lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar15);
            lVar15 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar15);
            auVar33 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar31 + lVar27) * 4);
            uVar18 = (ulong)*(uint *)(uVar31 + 0x10 + lVar27);
            auVar92 = *(undefined1 (*) [16])(lVar7 + uVar18 * 4);
            uVar19 = (ulong)*(uint *)(uVar31 + 0x20 + lVar27);
            auVar81 = *(undefined1 (*) [16])(lVar7 + uVar19 * 4);
            auVar45 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
            uVar20 = (ulong)*(uint *)(uVar31 + 0x14 + lVar27);
            auVar93 = *(undefined1 (*) [16])(lVar7 + uVar20 * 4);
            uVar21 = (ulong)*(uint *)(uVar31 + 0x24 + lVar27);
            auVar82 = *(undefined1 (*) [16])(lVar7 + uVar21 * 4);
            uVar22 = (ulong)*(uint *)(uVar31 + 8 + lVar27);
            auVar57 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
            uVar12 = (ulong)*(uint *)(uVar31 + 0x18 + lVar27);
            auVar73 = *(undefined1 (*) [16])(lVar7 + uVar12 * 4);
            uVar25 = (ulong)*(uint *)(uVar31 + 0x28 + lVar27);
            auVar94 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
            uVar26 = (ulong)*(uint *)(uVar31 + 0xc + lVar27);
            auVar34 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
            uVar14 = (ulong)*(uint *)(uVar31 + 0x1c + lVar27);
            auVar35 = *(undefined1 (*) [16])(lVar7 + uVar14 * 4);
            uVar16 = (ulong)*(uint *)(uVar31 + 0x2c + lVar27);
            auVar36 = *(undefined1 (*) [16])(lVar7 + uVar16 * 4);
            auVar46 = *(undefined1 (*) [16])(lVar15 + (ulong)*(uint *)(uVar31 + lVar27) * 4);
            auVar47 = *(undefined1 (*) [16])(lVar15 + uVar18 * 4);
            fVar143 = fVar143 - auVar61._0_4_;
            auVar61 = vunpcklps_avx(auVar33,auVar57);
            auVar57 = vunpckhps_avx(auVar33,auVar57);
            auVar62 = vunpcklps_avx(auVar45,auVar34);
            auVar45 = vunpckhps_avx(auVar45,auVar34);
            auVar33 = *(undefined1 (*) [16])(lVar15 + uVar28 * 4);
            auVar79 = vunpcklps_avx(auVar57,auVar45);
            auVar80 = vunpcklps_avx(auVar61,auVar62);
            auVar57 = vunpckhps_avx(auVar61,auVar62);
            auVar34 = vunpcklps_avx(auVar92,auVar73);
            auVar45 = vunpckhps_avx(auVar92,auVar73);
            auVar73 = vunpcklps_avx(auVar93,auVar35);
            auVar93 = vunpckhps_avx(auVar93,auVar35);
            auVar92 = *(undefined1 (*) [16])(lVar15 + uVar22 * 4);
            auVar35 = vunpcklps_avx(auVar45,auVar93);
            auVar61 = vunpcklps_avx(auVar34,auVar73);
            auVar93 = vunpckhps_avx(auVar34,auVar73);
            auVar34 = vunpcklps_avx(auVar81,auVar94);
            auVar73 = vunpckhps_avx(auVar81,auVar94);
            auVar62 = vunpcklps_avx(auVar82,auVar36);
            auVar94 = vunpckhps_avx(auVar82,auVar36);
            auVar45 = *(undefined1 (*) [16])(lVar15 + uVar26 * 4);
            auVar36 = vunpcklps_avx(auVar73,auVar94);
            auVar81 = vunpcklps_avx(auVar34,auVar62);
            auVar73 = vunpckhps_avx(auVar34,auVar62);
            auVar94 = vunpcklps_avx(auVar46,auVar92);
            auVar92 = vunpckhps_avx(auVar46,auVar92);
            auVar34 = vunpcklps_avx(auVar33,auVar45);
            auVar45 = vunpckhps_avx(auVar33,auVar45);
            auVar33 = *(undefined1 (*) [16])(lVar15 + uVar12 * 4);
            auVar46 = vunpcklps_avx(auVar92,auVar45);
            auVar62 = vunpcklps_avx(auVar94,auVar34);
            auVar45 = vunpckhps_avx(auVar94,auVar34);
            auVar34 = vunpcklps_avx(auVar47,auVar33);
            auVar94 = vunpckhps_avx(auVar47,auVar33);
            auVar33 = *(undefined1 (*) [16])(lVar15 + uVar20 * 4);
            auVar92 = *(undefined1 (*) [16])(lVar15 + uVar14 * 4);
            auVar47 = vunpcklps_avx(auVar33,auVar92);
            auVar33 = vunpckhps_avx(auVar33,auVar92);
            auVar82 = vunpcklps_avx(auVar94,auVar33);
            auVar98 = vunpcklps_avx(auVar34,auVar47);
            auVar94 = vunpckhps_avx(auVar34,auVar47);
            auVar33 = *(undefined1 (*) [16])(lVar15 + uVar19 * 4);
            auVar92 = *(undefined1 (*) [16])(lVar15 + uVar25 * 4);
            auVar47 = vunpcklps_avx(auVar33,auVar92);
            auVar34 = vunpckhps_avx(auVar33,auVar92);
            auVar33 = *(undefined1 (*) [16])(lVar15 + uVar21 * 4);
            auVar92 = *(undefined1 (*) [16])(lVar15 + uVar16 * 4);
            auVar97 = vunpcklps_avx(auVar33,auVar92);
            auVar33 = vunpckhps_avx(auVar33,auVar92);
            auVar99 = vunpcklps_avx(auVar34,auVar33);
            auVar107 = vunpcklps_avx(auVar47,auVar97);
            auVar34 = vunpckhps_avx(auVar47,auVar97);
            auVar33 = vshufps_avx(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),0);
            auVar92 = vshufps_avx(ZEXT416((uint)(1.0 - fVar143)),ZEXT416((uint)(1.0 - fVar143)),0);
            fVar67 = auVar33._0_4_;
            fVar68 = auVar33._4_4_;
            fVar71 = auVar33._8_4_;
            fVar170 = auVar33._12_4_;
            fVar143 = auVar92._0_4_;
            fVar146 = auVar92._4_4_;
            fVar148 = auVar92._8_4_;
            fVar150 = auVar92._12_4_;
            auVar111._0_4_ = fVar143 * auVar80._0_4_ + fVar67 * auVar62._0_4_;
            auVar111._4_4_ = fVar146 * auVar80._4_4_ + fVar68 * auVar62._4_4_;
            auVar111._8_4_ = fVar148 * auVar80._8_4_ + fVar71 * auVar62._8_4_;
            auVar111._12_4_ = fVar150 * auVar80._12_4_ + fVar170 * auVar62._12_4_;
            auVar116._0_4_ = fVar143 * auVar57._0_4_ + fVar67 * auVar45._0_4_;
            auVar116._4_4_ = fVar146 * auVar57._4_4_ + fVar68 * auVar45._4_4_;
            auVar116._8_4_ = fVar148 * auVar57._8_4_ + fVar71 * auVar45._8_4_;
            auVar116._12_4_ = fVar150 * auVar57._12_4_ + fVar170 * auVar45._12_4_;
            local_a68._0_4_ = auVar79._0_4_;
            local_a68._4_4_ = auVar79._4_4_;
            fStack_a60 = auVar79._8_4_;
            fStack_a5c = auVar79._12_4_;
            auVar97._0_4_ = fVar143 * (float)local_a68._0_4_ + fVar67 * auVar46._0_4_;
            auVar97._4_4_ = fVar146 * (float)local_a68._4_4_ + fVar68 * auVar46._4_4_;
            auVar97._8_4_ = fVar148 * fStack_a60 + fVar71 * auVar46._8_4_;
            auVar97._12_4_ = fVar150 * fStack_a5c + fVar170 * auVar46._12_4_;
            auVar124._0_4_ = fVar143 * auVar61._0_4_ + fVar67 * auVar98._0_4_;
            auVar124._4_4_ = fVar146 * auVar61._4_4_ + fVar68 * auVar98._4_4_;
            auVar124._8_4_ = fVar148 * auVar61._8_4_ + fVar71 * auVar98._8_4_;
            auVar124._12_4_ = fVar150 * auVar61._12_4_ + fVar170 * auVar98._12_4_;
            auVar106._0_4_ = fVar143 * auVar93._0_4_ + fVar67 * auVar94._0_4_;
            auVar106._4_4_ = fVar146 * auVar93._4_4_ + fVar68 * auVar94._4_4_;
            auVar106._8_4_ = fVar148 * auVar93._8_4_ + fVar71 * auVar94._8_4_;
            auVar106._12_4_ = fVar150 * auVar93._12_4_ + fVar170 * auVar94._12_4_;
            puVar2 = (undefined8 *)(uVar31 + 0x30 + lVar27);
            local_898 = *puVar2;
            uStack_890 = puVar2[1];
            puVar2 = (undefined8 *)(uVar31 + 0x40 + lVar27);
            local_a88._0_4_ = auVar35._0_4_;
            local_a88._4_4_ = auVar35._4_4_;
            fStack_a80 = auVar35._8_4_;
            fStack_a7c = auVar35._12_4_;
            auVar45._0_4_ = fVar143 * (float)local_a88._0_4_ + fVar67 * auVar82._0_4_;
            auVar45._4_4_ = fVar146 * (float)local_a88._4_4_ + fVar68 * auVar82._4_4_;
            auVar45._8_4_ = fVar148 * fStack_a80 + fVar71 * auVar82._8_4_;
            auVar45._12_4_ = fVar150 * fStack_a7c + fVar170 * auVar82._12_4_;
            local_a38._0_4_ = auVar81._0_4_;
            local_a38._4_4_ = auVar81._4_4_;
            fStack_a30 = auVar81._8_4_;
            fStack_a2c = auVar81._12_4_;
            auVar61._0_4_ = fVar143 * (float)local_a38._0_4_ + fVar67 * auVar107._0_4_;
            auVar61._4_4_ = fVar146 * (float)local_a38._4_4_ + fVar68 * auVar107._4_4_;
            auVar61._8_4_ = fVar148 * fStack_a30 + fVar71 * auVar107._8_4_;
            auVar61._12_4_ = fVar150 * fStack_a2c + fVar170 * auVar107._12_4_;
            local_aa8._0_4_ = auVar73._0_4_;
            local_aa8._4_4_ = auVar73._4_4_;
            fStack_aa0 = auVar73._8_4_;
            fStack_a9c = auVar73._12_4_;
            auVar166._0_4_ = fVar143 * (float)local_aa8._0_4_ + fVar67 * auVar34._0_4_;
            auVar166._4_4_ = fVar146 * (float)local_aa8._4_4_ + fVar68 * auVar34._4_4_;
            auVar166._8_4_ = fVar148 * fStack_aa0 + fVar71 * auVar34._8_4_;
            auVar166._12_4_ = fVar150 * fStack_a9c + fVar170 * auVar34._12_4_;
            local_a98._0_4_ = auVar36._0_4_;
            local_a98._4_4_ = auVar36._4_4_;
            fStack_a90 = auVar36._8_4_;
            fStack_a8c = auVar36._12_4_;
            auVar133._0_4_ = fVar67 * auVar99._0_4_ + fVar143 * (float)local_a98._0_4_;
            auVar133._4_4_ = fVar68 * auVar99._4_4_ + fVar146 * (float)local_a98._4_4_;
            auVar133._8_4_ = fVar71 * auVar99._8_4_ + fVar148 * fStack_a90;
            auVar133._12_4_ = fVar170 * auVar99._12_4_ + fVar150 * fStack_a8c;
            local_8a8 = *puVar2;
            uStack_8a0 = puVar2[1];
            uVar4 = *(undefined4 *)&(local_ac8->org).field_0;
            auVar34._4_4_ = uVar4;
            auVar34._0_4_ = uVar4;
            auVar34._8_4_ = uVar4;
            auVar34._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(local_ac8->org).field_0 + 4);
            auVar153._4_4_ = uVar4;
            auVar153._0_4_ = uVar4;
            auVar153._8_4_ = uVar4;
            auVar153._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(local_ac8->org).field_0 + 8);
            auVar159._4_4_ = uVar4;
            auVar159._0_4_ = uVar4;
            auVar159._8_4_ = uVar4;
            auVar159._12_4_ = uVar4;
            _local_a88 = vsubps_avx(auVar111,auVar34);
            _local_a98 = vsubps_avx(auVar116,auVar153);
            _local_aa8 = vsubps_avx(auVar97,auVar159);
            auVar33 = vsubps_avx(auVar124,auVar34);
            auVar92 = vsubps_avx(auVar106,auVar153);
            auVar45 = vsubps_avx(auVar45,auVar159);
            auVar93 = vsubps_avx(auVar61,auVar34);
            auVar57 = vsubps_avx(auVar166,auVar153);
            auVar73 = vsubps_avx(auVar133,auVar159);
            _local_a38 = vsubps_avx(auVar93,_local_a88);
            local_a48 = vsubps_avx(auVar57,_local_a98);
            local_a58 = vsubps_avx(auVar73,_local_aa8);
            fVar143 = local_a98._0_4_;
            fVar42 = auVar57._0_4_ + fVar143;
            fVar150 = local_a98._4_4_;
            fVar53 = auVar57._4_4_ + fVar150;
            fVar71 = local_a98._8_4_;
            fVar54 = auVar57._8_4_ + fVar71;
            fVar9 = local_a98._12_4_;
            fVar55 = auVar57._12_4_ + fVar9;
            fVar146 = local_aa8._0_4_;
            fVar90 = auVar73._0_4_ + fVar146;
            fVar67 = local_aa8._4_4_;
            fVar100 = auVar73._4_4_ + fVar67;
            fVar170 = local_aa8._8_4_;
            fVar102 = auVar73._8_4_ + fVar170;
            fVar10 = local_aa8._12_4_;
            fVar104 = auVar73._12_4_ + fVar10;
            fVar56 = local_a58._0_4_;
            auVar125._0_4_ = fVar56 * fVar42;
            fVar70 = local_a58._4_4_;
            auVar125._4_4_ = fVar70 * fVar53;
            fVar40 = local_a58._8_4_;
            auVar125._8_4_ = fVar40 * fVar54;
            fVar41 = local_a58._12_4_;
            auVar125._12_4_ = fVar41 * fVar55;
            fVar165 = local_a48._0_4_;
            auVar134._0_4_ = fVar165 * fVar90;
            fVar168 = local_a48._4_4_;
            auVar134._4_4_ = fVar168 * fVar100;
            fVar169 = local_a48._8_4_;
            auVar134._8_4_ = fVar169 * fVar102;
            fVar171 = local_a48._12_4_;
            auVar134._12_4_ = fVar171 * fVar104;
            auVar94 = vsubps_avx(auVar134,auVar125);
            fVar148 = local_a88._0_4_;
            fVar123 = auVar93._0_4_ + fVar148;
            fVar68 = local_a88._4_4_;
            fVar130 = auVar93._4_4_ + fVar68;
            fVar8 = local_a88._8_4_;
            fVar131 = auVar93._8_4_ + fVar8;
            fVar11 = local_a88._12_4_;
            fVar132 = auVar93._12_4_ + fVar11;
            fVar158 = local_a38._0_4_;
            auVar98._0_4_ = fVar158 * fVar90;
            fVar162 = local_a38._4_4_;
            auVar98._4_4_ = fVar162 * fVar100;
            fVar163 = local_a38._8_4_;
            auVar98._8_4_ = fVar163 * fVar102;
            fVar164 = local_a38._12_4_;
            auVar98._12_4_ = fVar164 * fVar104;
            auVar135._0_4_ = fVar123 * fVar56;
            auVar135._4_4_ = fVar130 * fVar70;
            auVar135._8_4_ = fVar131 * fVar40;
            auVar135._12_4_ = fVar132 * fVar41;
            auVar34 = vsubps_avx(auVar135,auVar98);
            auVar126._0_4_ = fVar165 * fVar123;
            auVar126._4_4_ = fVar168 * fVar130;
            auVar126._8_4_ = fVar169 * fVar131;
            auVar126._12_4_ = fVar171 * fVar132;
            auVar35._0_4_ = fVar158 * fVar42;
            auVar35._4_4_ = fVar162 * fVar53;
            auVar35._8_4_ = fVar163 * fVar54;
            auVar35._12_4_ = fVar164 * fVar55;
            auVar35 = vsubps_avx(auVar35,auVar126);
            fStack_ae4 = (local_ac8->dir).field_0.m128[2];
            local_ad8._4_4_ = (local_ac8->dir).field_0.m128[1];
            fStack_ab0 = (local_ac8->dir).field_0.m128[0];
            local_ab8 = CONCAT44(fStack_ab0,fStack_ab0);
            fStack_aac = fStack_ab0;
            local_af8._0_4_ =
                 auVar94._0_4_ * fStack_ab0 +
                 local_ad8._4_4_ * auVar34._0_4_ + fStack_ae4 * auVar35._0_4_;
            local_af8._4_4_ =
                 auVar94._4_4_ * fStack_ab0 +
                 local_ad8._4_4_ * auVar34._4_4_ + fStack_ae4 * auVar35._4_4_;
            local_af8._8_4_ =
                 auVar94._8_4_ * fStack_ab0 +
                 local_ad8._4_4_ * auVar34._8_4_ + fStack_ae4 * auVar35._8_4_;
            local_af8._12_4_ =
                 auVar94._12_4_ * fStack_ab0 +
                 local_ad8._4_4_ * auVar34._12_4_ + fStack_ae4 * auVar35._12_4_;
            _local_a68 = vsubps_avx(_local_a98,auVar92);
            local_8d8 = vsubps_avx(_local_aa8,auVar45);
            fVar53 = fVar143 + auVar92._0_4_;
            fVar55 = fVar150 + auVar92._4_4_;
            fVar100 = fVar71 + auVar92._8_4_;
            fVar104 = fVar9 + auVar92._12_4_;
            fVar123 = fVar146 + auVar45._0_4_;
            fVar130 = fVar67 + auVar45._4_4_;
            fVar131 = fVar170 + auVar45._8_4_;
            fVar132 = fVar10 + auVar45._12_4_;
            fVar42 = local_8d8._0_4_;
            auVar160._0_4_ = fVar42 * fVar53;
            fVar54 = local_8d8._4_4_;
            auVar160._4_4_ = fVar54 * fVar55;
            fVar90 = local_8d8._8_4_;
            auVar160._8_4_ = fVar90 * fVar100;
            fVar102 = local_8d8._12_4_;
            auVar160._12_4_ = fVar102 * fVar104;
            fVar152 = local_a68._0_4_;
            auVar79._0_4_ = fVar152 * fVar123;
            fVar155 = local_a68._4_4_;
            auVar79._4_4_ = fVar155 * fVar130;
            fVar156 = local_a68._8_4_;
            auVar79._8_4_ = fVar156 * fVar131;
            fVar157 = local_a68._12_4_;
            auVar79._12_4_ = fVar157 * fVar132;
            auVar94 = vsubps_avx(auVar79,auVar160);
            local_8c8 = vsubps_avx(_local_a88,auVar33);
            fVar138 = local_8c8._0_4_;
            auVar99._0_4_ = fVar138 * fVar123;
            fVar140 = local_8c8._4_4_;
            auVar99._4_4_ = fVar140 * fVar130;
            fVar141 = local_8c8._8_4_;
            auVar99._8_4_ = fVar141 * fVar131;
            fVar142 = local_8c8._12_4_;
            auVar99._12_4_ = fVar142 * fVar132;
            fVar123 = fVar148 + auVar33._0_4_;
            fVar130 = fVar68 + auVar33._4_4_;
            fVar131 = fVar8 + auVar33._8_4_;
            fVar132 = fVar11 + auVar33._12_4_;
            auVar127._0_4_ = fVar42 * fVar123;
            auVar127._4_4_ = fVar54 * fVar130;
            auVar127._8_4_ = fVar90 * fVar131;
            auVar127._12_4_ = fVar102 * fVar132;
            auVar34 = vsubps_avx(auVar127,auVar99);
            auVar117._0_4_ = fVar152 * fVar123;
            auVar117._4_4_ = fVar155 * fVar130;
            auVar117._8_4_ = fVar156 * fVar131;
            auVar117._12_4_ = fVar157 * fVar132;
            auVar36._0_4_ = fVar138 * fVar53;
            auVar36._4_4_ = fVar140 * fVar55;
            auVar36._8_4_ = fVar141 * fVar100;
            auVar36._12_4_ = fVar142 * fVar104;
            auVar35 = vsubps_avx(auVar36,auVar117);
            local_878._0_4_ =
                 fStack_ab0 * auVar94._0_4_ +
                 local_ad8._4_4_ * auVar34._0_4_ + fStack_ae4 * auVar35._0_4_;
            local_878._4_4_ =
                 fStack_ab0 * auVar94._4_4_ +
                 local_ad8._4_4_ * auVar34._4_4_ + fStack_ae4 * auVar35._4_4_;
            local_878._8_4_ =
                 fStack_ab0 * auVar94._8_4_ +
                 local_ad8._4_4_ * auVar34._8_4_ + fStack_ae4 * auVar35._8_4_;
            local_878._12_4_ =
                 fStack_ab0 * auVar94._12_4_ +
                 local_ad8._4_4_ * auVar34._12_4_ + fStack_ae4 * auVar35._12_4_;
            auVar94 = vsubps_avx(auVar33,auVar93);
            fVar72 = auVar33._0_4_ + auVar93._0_4_;
            fVar87 = auVar33._4_4_ + auVar93._4_4_;
            fVar88 = auVar33._8_4_ + auVar93._8_4_;
            fVar89 = auVar33._12_4_ + auVar93._12_4_;
            auVar33 = vsubps_avx(auVar92,auVar57);
            fVar130 = auVar92._0_4_ + auVar57._0_4_;
            fVar131 = auVar92._4_4_ + auVar57._4_4_;
            fVar132 = auVar92._8_4_ + auVar57._8_4_;
            fVar69 = auVar92._12_4_ + auVar57._12_4_;
            auVar92 = vsubps_avx(auVar45,auVar73);
            fVar55 = auVar45._0_4_ + auVar73._0_4_;
            fVar100 = auVar45._4_4_ + auVar73._4_4_;
            fVar104 = auVar45._8_4_ + auVar73._8_4_;
            fVar123 = auVar45._12_4_ + auVar73._12_4_;
            fVar91 = auVar92._0_4_;
            auVar107._0_4_ = fVar91 * fVar130;
            fVar101 = auVar92._4_4_;
            auVar107._4_4_ = fVar101 * fVar131;
            fVar103 = auVar92._8_4_;
            auVar107._8_4_ = fVar103 * fVar132;
            fVar105 = auVar92._12_4_;
            auVar107._12_4_ = fVar105 * fVar69;
            fVar144 = auVar33._0_4_;
            auVar118._0_4_ = fVar144 * fVar55;
            fVar147 = auVar33._4_4_;
            auVar118._4_4_ = fVar147 * fVar100;
            fVar149 = auVar33._8_4_;
            auVar118._8_4_ = fVar149 * fVar104;
            fVar151 = auVar33._12_4_;
            auVar118._12_4_ = fVar151 * fVar123;
            auVar33 = vsubps_avx(auVar118,auVar107);
            fVar53 = auVar94._0_4_;
            auVar46._0_4_ = fVar53 * fVar55;
            fVar55 = auVar94._4_4_;
            auVar46._4_4_ = fVar55 * fVar100;
            fVar100 = auVar94._8_4_;
            auVar46._8_4_ = fVar100 * fVar104;
            fVar104 = auVar94._12_4_;
            auVar46._12_4_ = fVar104 * fVar123;
            auVar119._0_4_ = fVar91 * fVar72;
            auVar119._4_4_ = fVar101 * fVar87;
            auVar119._8_4_ = fVar103 * fVar88;
            auVar119._12_4_ = fVar105 * fVar89;
            auVar92 = vsubps_avx(auVar119,auVar46);
            auVar80._0_4_ = fVar144 * fVar72;
            auVar80._4_4_ = fVar147 * fVar87;
            auVar80._8_4_ = fVar149 * fVar88;
            auVar80._12_4_ = fVar151 * fVar89;
            auVar62._0_4_ = fVar53 * fVar130;
            auVar62._4_4_ = fVar55 * fVar131;
            auVar62._8_4_ = fVar100 * fVar132;
            auVar62._12_4_ = fVar104 * fVar69;
            auVar45 = vsubps_avx(auVar62,auVar80);
            local_ae8 = fStack_ae4;
            fStack_ae0 = fStack_ae4;
            fStack_adc = fStack_ae4;
            local_ad8._0_4_ = local_ad8._4_4_;
            fStack_ad0 = local_ad8._4_4_;
            fStack_acc = local_ad8._4_4_;
            auVar47._0_4_ =
                 fStack_ab0 * auVar33._0_4_ +
                 local_ad8._4_4_ * auVar92._0_4_ + fStack_ae4 * auVar45._0_4_;
            auVar47._4_4_ =
                 fStack_ab0 * auVar33._4_4_ +
                 local_ad8._4_4_ * auVar92._4_4_ + fStack_ae4 * auVar45._4_4_;
            auVar47._8_4_ =
                 fStack_ab0 * auVar33._8_4_ +
                 local_ad8._4_4_ * auVar92._8_4_ + fStack_ae4 * auVar45._8_4_;
            auVar47._12_4_ =
                 fStack_ab0 * auVar33._12_4_ +
                 local_ad8._4_4_ * auVar92._12_4_ + fStack_ae4 * auVar45._12_4_;
            local_868._0_4_ = auVar47._0_4_ + local_af8._0_4_ + local_878._0_4_;
            local_868._4_4_ = auVar47._4_4_ + local_af8._4_4_ + local_878._4_4_;
            local_868._8_4_ = auVar47._8_4_ + local_af8._8_4_ + local_878._8_4_;
            local_868._12_4_ = auVar47._12_4_ + local_af8._12_4_ + local_878._12_4_;
            auVar33 = vminps_avx(local_af8,local_878);
            auVar33 = vminps_avx(auVar33,auVar47);
            auVar81._8_4_ = 0x7fffffff;
            auVar81._0_8_ = 0x7fffffff7fffffff;
            auVar81._12_4_ = 0x7fffffff;
            local_8e8 = vandps_avx(local_868,auVar81);
            auVar82._0_4_ = local_8e8._0_4_ * 1.1920929e-07;
            auVar82._4_4_ = local_8e8._4_4_ * 1.1920929e-07;
            auVar82._8_4_ = local_8e8._8_4_ * 1.1920929e-07;
            auVar82._12_4_ = local_8e8._12_4_ * 1.1920929e-07;
            uVar12 = CONCAT44(auVar82._4_4_,auVar82._0_4_);
            auVar108._0_8_ = uVar12 ^ 0x8000000080000000;
            auVar108._8_4_ = -auVar82._8_4_;
            auVar108._12_4_ = -auVar82._12_4_;
            auVar33 = vcmpps_avx(auVar33,auVar108,5);
            auVar92 = vmaxps_avx(local_af8,local_878);
            auVar92 = vmaxps_avx(auVar92,auVar47);
            auVar92 = vcmpps_avx(auVar92,auVar82,2);
            local_8f8 = vorps_avx(auVar33,auVar92);
            local_af9 = 0;
            auVar33 = local_9a8 & local_8f8;
            ray = local_ac8;
            pSVar24 = local_a78;
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') {
              auVar48._0_4_ = fVar152 * fVar56;
              auVar48._4_4_ = fVar155 * fVar70;
              auVar48._8_4_ = fVar156 * fVar40;
              auVar48._12_4_ = fVar157 * fVar41;
              auVar63._0_4_ = fVar165 * fVar42;
              auVar63._4_4_ = fVar168 * fVar54;
              auVar63._8_4_ = fVar169 * fVar90;
              auVar63._12_4_ = fVar171 * fVar102;
              auVar45 = vsubps_avx(auVar63,auVar48);
              auVar83._0_4_ = fVar42 * fVar144;
              auVar83._4_4_ = fVar54 * fVar147;
              auVar83._8_4_ = fVar90 * fVar149;
              auVar83._12_4_ = fVar102 * fVar151;
              auVar109._0_4_ = fVar152 * fVar91;
              auVar109._4_4_ = fVar155 * fVar101;
              auVar109._8_4_ = fVar156 * fVar103;
              auVar109._12_4_ = fVar157 * fVar105;
              auVar93 = vsubps_avx(auVar109,auVar83);
              auVar33 = vandps_avx(auVar81,auVar48);
              auVar92 = vandps_avx(auVar81,auVar83);
              auVar33 = vcmpps_avx(auVar33,auVar92,1);
              local_808 = vblendvps_avx(auVar93,auVar45,auVar33);
              auVar49._0_4_ = fVar138 * fVar91;
              auVar49._4_4_ = fVar140 * fVar101;
              auVar49._8_4_ = fVar141 * fVar103;
              auVar49._12_4_ = fVar142 * fVar105;
              auVar64._0_4_ = fVar138 * fVar56;
              auVar64._4_4_ = fVar140 * fVar70;
              auVar64._8_4_ = fVar141 * fVar40;
              auVar64._12_4_ = fVar142 * fVar41;
              auVar84._0_4_ = fVar42 * fVar158;
              auVar84._4_4_ = fVar54 * fVar162;
              auVar84._8_4_ = fVar90 * fVar163;
              auVar84._12_4_ = fVar102 * fVar164;
              auVar45 = vsubps_avx(auVar64,auVar84);
              auVar112._0_4_ = fVar42 * fVar53;
              auVar112._4_4_ = fVar54 * fVar55;
              auVar112._8_4_ = fVar90 * fVar100;
              auVar112._12_4_ = fVar102 * fVar104;
              auVar93 = vsubps_avx(auVar112,auVar49);
              auVar33 = vandps_avx(auVar81,auVar84);
              auVar92 = vandps_avx(auVar81,auVar49);
              auVar33 = vcmpps_avx(auVar33,auVar92,1);
              local_7f8 = vblendvps_avx(auVar93,auVar45,auVar33);
              auVar37._0_4_ = fVar152 * fVar53;
              auVar37._4_4_ = fVar155 * fVar55;
              auVar37._8_4_ = fVar156 * fVar100;
              auVar37._12_4_ = fVar157 * fVar104;
              auVar65._0_4_ = fVar152 * fVar158;
              auVar65._4_4_ = fVar155 * fVar162;
              auVar65._8_4_ = fVar156 * fVar163;
              auVar65._12_4_ = fVar157 * fVar164;
              auVar85._0_4_ = fVar165 * fVar138;
              auVar85._4_4_ = fVar168 * fVar140;
              auVar85._8_4_ = fVar169 * fVar141;
              auVar85._12_4_ = fVar171 * fVar142;
              auVar113._0_4_ = fVar138 * fVar144;
              auVar113._4_4_ = fVar140 * fVar147;
              auVar113._8_4_ = fVar141 * fVar149;
              auVar113._12_4_ = fVar142 * fVar151;
              auVar45 = vsubps_avx(auVar65,auVar85);
              auVar93 = vsubps_avx(auVar113,auVar37);
              auVar33 = vandps_avx(auVar81,auVar85);
              auVar92 = vandps_avx(auVar81,auVar37);
              auVar33 = vcmpps_avx(auVar33,auVar92,1);
              local_7e8 = vblendvps_avx(auVar93,auVar45,auVar33);
              fVar56 = local_808._0_4_ * fStack_ab0 +
                       local_7f8._0_4_ * local_ad8._4_4_ + local_7e8._0_4_ * fStack_ae4;
              fVar42 = local_808._4_4_ * fStack_ab0 +
                       local_7f8._4_4_ * local_ad8._4_4_ + local_7e8._4_4_ * fStack_ae4;
              fVar53 = local_808._8_4_ * fStack_ab0 +
                       local_7f8._8_4_ * local_ad8._4_4_ + local_7e8._8_4_ * fStack_ae4;
              fVar70 = local_808._12_4_ * fStack_ab0 +
                       local_7f8._12_4_ * local_ad8._4_4_ + local_7e8._12_4_ * fStack_ae4;
              auVar86._0_4_ = fVar56 + fVar56;
              auVar86._4_4_ = fVar42 + fVar42;
              auVar86._8_4_ = fVar53 + fVar53;
              auVar86._12_4_ = fVar70 + fVar70;
              fVar56 = local_808._0_4_ * fVar148 +
                       local_7f8._0_4_ * fVar143 + local_7e8._0_4_ * fVar146;
              fVar67 = local_808._4_4_ * fVar68 +
                       local_7f8._4_4_ * fVar150 + local_7e8._4_4_ * fVar67;
              fVar68 = local_808._8_4_ * fVar8 +
                       local_7f8._8_4_ * fVar71 + local_7e8._8_4_ * fVar170;
              fVar71 = local_808._12_4_ * fVar11 +
                       local_7f8._12_4_ * fVar9 + local_7e8._12_4_ * fVar10;
              auVar33 = vrcpps_avx(auVar86);
              fVar143 = auVar33._0_4_;
              auVar120._0_4_ = auVar86._0_4_ * fVar143;
              fVar146 = auVar33._4_4_;
              auVar120._4_4_ = auVar86._4_4_ * fVar146;
              fVar148 = auVar33._8_4_;
              auVar120._8_4_ = auVar86._8_4_ * fVar148;
              fVar150 = auVar33._12_4_;
              auVar120._12_4_ = auVar86._12_4_ * fVar150;
              auVar128._8_4_ = 0x3f800000;
              auVar128._0_8_ = 0x3f8000003f800000;
              auVar128._12_4_ = 0x3f800000;
              auVar33 = vsubps_avx(auVar128,auVar120);
              local_818._0_4_ = (fVar56 + fVar56) * (fVar143 + fVar143 * auVar33._0_4_);
              local_818._4_4_ = (fVar67 + fVar67) * (fVar146 + fVar146 * auVar33._4_4_);
              local_818._8_4_ = (fVar68 + fVar68) * (fVar148 + fVar148 * auVar33._8_4_);
              local_818._12_4_ = (fVar71 + fVar71) * (fVar150 + fVar150 * auVar33._12_4_);
              uVar4 = *(undefined4 *)((long)&(local_ac8->org).field_0 + 0xc);
              auVar114._4_4_ = uVar4;
              auVar114._0_4_ = uVar4;
              auVar114._8_4_ = uVar4;
              auVar114._12_4_ = uVar4;
              auVar33 = vcmpps_avx(auVar114,local_818,2);
              fVar143 = local_ac8->tfar;
              auVar121._4_4_ = fVar143;
              auVar121._0_4_ = fVar143;
              auVar121._8_4_ = fVar143;
              auVar121._12_4_ = fVar143;
              auVar92 = vcmpps_avx(local_818,auVar121,2);
              auVar33 = vandps_avx(auVar33,auVar92);
              auVar92 = vcmpps_avx(auVar86,_DAT_01f7aa10,4);
              auVar33 = vandps_avx(auVar92,auVar33);
              auVar92 = vpand_avx(local_8f8,local_9a8);
              auVar33 = vpslld_avx(auVar33,0x1f);
              auVar33 = vpsrad_avx(auVar33,0x1f);
              local_848 = vpand_avx(auVar33,auVar92);
              uVar13 = vmovmskps_avx(local_848);
              if (uVar13 != 0) {
                local_888 = local_af8;
                local_858 = &local_af9;
                auVar33 = vrcpps_avx(local_868);
                fVar143 = auVar33._0_4_;
                auVar50._0_4_ = local_868._0_4_ * fVar143;
                fVar146 = auVar33._4_4_;
                auVar50._4_4_ = local_868._4_4_ * fVar146;
                fVar148 = auVar33._8_4_;
                auVar50._8_4_ = local_868._8_4_ * fVar148;
                fVar150 = auVar33._12_4_;
                auVar50._12_4_ = local_868._12_4_ * fVar150;
                auVar66._8_4_ = 0x3f800000;
                auVar66._0_8_ = 0x3f8000003f800000;
                auVar66._12_4_ = 0x3f800000;
                auVar33 = vsubps_avx(auVar66,auVar50);
                auVar38._0_4_ = fVar143 + fVar143 * auVar33._0_4_;
                auVar38._4_4_ = fVar146 + fVar146 * auVar33._4_4_;
                auVar38._8_4_ = fVar148 + fVar148 * auVar33._8_4_;
                auVar38._12_4_ = fVar150 + fVar150 * auVar33._12_4_;
                auVar51._8_4_ = 0x219392ef;
                auVar51._0_8_ = 0x219392ef219392ef;
                auVar51._12_4_ = 0x219392ef;
                auVar33 = vcmpps_avx(local_8e8,auVar51,5);
                auVar33 = vandps_avx(auVar33,auVar38);
                auVar52._0_4_ = local_af8._0_4_ * auVar33._0_4_;
                auVar52._4_4_ = local_af8._4_4_ * auVar33._4_4_;
                auVar52._8_4_ = local_af8._8_4_ * auVar33._8_4_;
                auVar52._12_4_ = local_af8._12_4_ * auVar33._12_4_;
                local_838 = vminps_avx(auVar52,auVar66);
                auVar39._0_4_ = local_878._0_4_ * auVar33._0_4_;
                auVar39._4_4_ = local_878._4_4_ * auVar33._4_4_;
                auVar39._8_4_ = local_878._8_4_ * auVar33._8_4_;
                auVar39._12_4_ = local_878._12_4_ * auVar33._12_4_;
                local_828 = vminps_avx(auVar39,auVar66);
                local_ab8 = (ulong)(uVar13 & 0xff);
                do {
                  uVar12 = 0;
                  if (local_ab8 != 0) {
                    for (; (local_ab8 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  local_9f0 = *(uint *)((long)&local_898 + uVar12 * 4);
                  pGVar6 = (pSVar24->geometries).items[local_9f0].ptr;
                  if ((pGVar6->mask & ray->mask) == 0) {
                    local_ab8 = local_ab8 ^ 1L << (uVar12 & 0x3f);
                  }
                  else {
                    auVar23 = (undefined1  [8])local_a70->args;
                    if ((((RTCIntersectArguments *)auVar23)->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002c3089;
                    local_9d8.context = local_a70->user;
                    local_a08 = *(undefined4 *)(local_808 + uVar12 * 4);
                    local_a04 = *(undefined4 *)(local_7f8 + uVar12 * 4);
                    local_a00 = *(undefined4 *)(local_7e8 + uVar12 * 4);
                    local_9fc = *(undefined4 *)(local_838 + uVar12 * 4);
                    local_9f8 = *(undefined4 *)(local_828 + uVar12 * 4);
                    local_9f4 = *(undefined4 *)((long)&local_8a8 + uVar12 * 4);
                    local_9ec = (local_9d8.context)->instID[0];
                    local_9e8 = (local_9d8.context)->instPrimID[0];
                    local_ae8 = ray->tfar;
                    local_ad8 = uVar12;
                    ray->tfar = *(float *)(local_818 + uVar12 * 4);
                    local_abc = -1;
                    local_9d8.valid = &local_abc;
                    local_9d8.geometryUserPtr = pGVar6->userPtr;
                    local_9d8.hit = (RTCHitN *)&local_a08;
                    local_9d8.N = 1;
                    local_af8._0_8_ = pGVar6;
                    local_9d8.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002c2f6e:
                      ray = local_ac8;
                      if ((((RTCIntersectArguments *)auVar23)->filter == (RTCFilterFunctionN)0x0) ||
                         ((((((RTCIntersectArguments *)auVar23)->flags &
                            RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT &&
                           ((*(byte *)(local_af8._0_8_ + 0x3e) & 0x40) == 0)) ||
                          ((*((RTCIntersectArguments *)auVar23)->filter)(&local_9d8),
                          ray = local_ac8, *local_9d8.valid != 0)))) {
LAB_002c3089:
                        ray->tfar = -INFINITY;
                        return;
                      }
                    }
                    else {
                      local_a88 = auVar23;
                      (*pGVar6->occlusionFilterN)(&local_9d8);
                      auVar23 = local_a88;
                      if (*local_9d8.valid != 0) goto LAB_002c2f6e;
                    }
                    local_ac8->tfar = local_ae8;
                    local_ab8 = local_ab8 ^ 1L << (local_ad8 & 0x3f);
                    ray = local_ac8;
                    pSVar24 = local_a78;
                  }
                } while (local_ab8 != 0);
              }
            }
            local_a10 = local_a10 + 1;
            auVar122 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar115 = ZEXT1664(local_908);
            auVar129 = ZEXT1664(local_918);
            auVar136 = ZEXT1664(local_928);
            auVar137 = ZEXT1664(local_938);
            auVar139 = ZEXT1664(local_948);
            auVar145 = ZEXT1664(local_958);
            auVar154 = ZEXT1664(local_968);
            auVar161 = ZEXT1664(local_978);
            auVar110 = ZEXT1664(local_988);
            auVar167 = ZEXT1664(local_998);
          } while (local_a10 != local_a28);
        }
LAB_002c3079:
      } while (local_a18 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }